

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
* __thiscall
wallet::CWallet::GetActiveScriptPubKeyMans
          (set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *__return_storage_ptr__,CWallet *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long lVar5;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *spk_managers;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *pmVar6;
  long lVar7;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man;
  ScriptPubKeyMan *local_48;
  char local_3a [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar5 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3a[0] = '\0';
  local_3a[1] = '\x01';
  do {
    pmVar6 = &this->m_external_spk_managers;
    if (local_3a[lVar5] != '\0') {
      pmVar6 = &this->m_internal_spk_managers;
    }
    p_Var1 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
    lVar7 = 0;
    do {
      p_Var4 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 != (_Base_ptr)0x0) {
        iVar2 = *(int *)((long)OUTPUT_TYPES._M_elems + lVar7);
        p_Var3 = &p_Var1->_M_header;
        do {
          if (iVar2 <= (int)*(size_t *)(p_Var4 + 1)) {
            p_Var3 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < iVar2];
        } while (p_Var4 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var3 != p_Var1) &&
            ((int)((_Rb_tree_header *)p_Var3)->_M_node_count <= iVar2)) &&
           (local_48 = *(ScriptPubKeyMan **)((long)p_Var3 + 0x28),
           local_48 != (ScriptPubKeyMan *)0x0)) {
          std::
          _Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
          ::_M_insert_unique<wallet::ScriptPubKeyMan*const&>
                    ((_Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
                      *)__return_storage_ptr__,&local_48);
        }
      }
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x10);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<ScriptPubKeyMan*> CWallet::GetActiveScriptPubKeyMans() const
{
    std::set<ScriptPubKeyMan*> spk_mans;
    for (bool internal : {false, true}) {
        for (OutputType t : OUTPUT_TYPES) {
            auto spk_man = GetScriptPubKeyMan(t, internal);
            if (spk_man) {
                spk_mans.insert(spk_man);
            }
        }
    }
    return spk_mans;
}